

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O3

void cilk_fiber_tbb_interop_free_stack_op_info(void)

{
  __cilk_tbb_stack_op_thunk *ptr;
  
  ptr = __cilkrts_get_tls_tbb_interop();
  if (ptr != (__cilk_tbb_stack_op_thunk *)0x0) {
    __cilkrts_free(ptr);
    __cilkrts_set_tls_tbb_interop((__cilk_tbb_stack_op_thunk *)0x0);
    return;
  }
  return;
}

Assistant:

void cilk_fiber_tbb_interop_free_stack_op_info(void)
{
    __cilk_tbb_stack_op_thunk *saved_thunk =
        __cilkrts_get_tls_tbb_interop();

    // If we haven't allocated a TBB interop index, we don't have any saved info
    if (NULL == saved_thunk)
        return;

    DBG_STACK_OPS ("tbb_interop_free_stack_op_info - freeing saved info\n");

    // Free the memory and wipe out the TLS value
    __cilkrts_free(saved_thunk);
    __cilkrts_set_tls_tbb_interop(NULL);
}